

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertModel(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *this)

{
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  this_00 = &this->flat_cvt_;
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<mp::ArrayRef<int>_(const_mp::SuffixDef<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:133:9)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<mp::ArrayRef<int>_(const_mp::SuffixDef<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:133:9)>
             ::_M_manager;
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:135:9)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:135:9)>
             ::_M_manager;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_mp::SuffixDef<int>_&,_mp::ArrayRef<int>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:137:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_mp::SuffixDef<int>_&,_mp::ArrayRef<int>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:137:9)>
             ::_M_manager;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_mp::SuffixDef<double>_&,_mp::ArrayRef<double>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:139:9)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_mp::SuffixDef<double>_&,_mp::ArrayRef<double>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:139:9)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  local_70._M_unused._M_object = this;
  local_50._M_unused._M_object = this;
  local_30._M_unused._M_object = this;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::SetSuffixManip((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)this_00,(SuffixGetterSetter *)&local_90);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::OpenGraphExporter((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)this_00);
  ConvertStandardItems(this);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::FinishModelInput((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)this_00);
  return;
}

Assistant:

void ConvertModel() override {
    GetFlatCvt().SetSuffixManip( {
        [this](const SuffixDef<int>& sd)
                                 { return GetModel().ReadIntSuffix(sd); },
        [this](const SuffixDef<double>& sd)
                                 { return GetModel().ReadDblSuffix(sd); },
        [this](const SuffixDef<int>& sd, ArrayRef<int> data)
                                 { GetModel().ReportSuffix(sd, data); },
        [this](const SuffixDef<double>& sd, ArrayRef<double> data)
                                 { GetModel().ReportSuffix(sd, data); }
    } );
    GetFlatCvt().StartModelInput();
    MP_DISPATCH( ConvertStandardItems() );
    GetFlatCvt().FinishModelInput();      // Chance to flush to the Backend
  }